

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::PathDescriptionSyntax::setChild
          (PathDescriptionSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00231034 + *(int *)(&DAT_00231034 + index * 4)))();
  return;
}

Assistant:

void PathDescriptionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openParen = child.token(); return;
        case 1: edgeIdentifier = child.token(); return;
        case 2: inputs = child.node()->as<SeparatedSyntaxList<NameSyntax>>(); return;
        case 3: polarityOperator = child.token(); return;
        case 4: pathOperator = child.token(); return;
        case 5: suffix = child.node() ? &child.node()->as<PathSuffixSyntax>() : nullptr; return;
        case 6: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}